

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t ctrl_set_layer_id(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  int *piVar2;
  undefined8 *local_30;
  aom_svc_layer_id_t *data;
  __va_list_tag *args_local;
  aom_codec_alg_priv_t_conflict *ctx_local;
  
  uVar1 = args->gp_offset;
  if (uVar1 < 0x29) {
    local_30 = (undefined8 *)((long)(int)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    local_30 = (undefined8 *)args->overflow_arg_area;
    args->overflow_arg_area = local_30 + 1;
  }
  piVar2 = (int *)*local_30;
  (ctx->ppi->cpi->common).spatial_layer_id = *piVar2;
  (ctx->ppi->cpi->common).temporal_layer_id = piVar2[1];
  (ctx->ppi->cpi->svc).spatial_layer_id = *piVar2;
  (ctx->ppi->cpi->svc).temporal_layer_id = piVar2[1];
  return AOM_CODEC_OK;
}

Assistant:

static aom_codec_err_t ctrl_set_layer_id(aom_codec_alg_priv_t *ctx,
                                         va_list args) {
  aom_svc_layer_id_t *const data = va_arg(args, aom_svc_layer_id_t *);
  ctx->ppi->cpi->common.spatial_layer_id = data->spatial_layer_id;
  ctx->ppi->cpi->common.temporal_layer_id = data->temporal_layer_id;
  ctx->ppi->cpi->svc.spatial_layer_id = data->spatial_layer_id;
  ctx->ppi->cpi->svc.temporal_layer_id = data->temporal_layer_id;
  return AOM_CODEC_OK;
}